

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::finish_note(Renderer *this,int i)

{
  byte bVar1;
  Voice *v;
  
  bVar1 = this->voice[i].status;
  if ((bVar1 & 5) == 1) {
    v = this->voice + i;
    v->status = bVar1 & 0xf9 | 4;
    if ((v->sample->modes & 0x40) == 0) {
      v->status = bVar1 & 0xe9 | 4;
    }
    Envelope::Release(&v->eg1,v);
    Envelope::Release(&v->eg2,v);
    return;
  }
  return;
}

Assistant:

void Renderer::finish_note(int i)
{
	Voice *v = &voice[i];

	if ((v->status & (VOICE_RUNNING | VOICE_RELEASING)) == VOICE_RUNNING)
	{
		v->status &= ~VOICE_SUSTAINING;
		v->status |= VOICE_RELEASING;

		if (!(v->sample->modes & PATCH_NO_SRELEASE))
		{
			v->status &= ~VOICE_LPE;	/* sampled release */
		}
		v->eg1.Release(v);
		v->eg2.Release(v);
	}
}